

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

BigInt<unsigned_int,_unsigned_long> *
scp::operator<<(BigInt<unsigned_int,_unsigned_long> *__return_storage_ptr__,
               BigInt<unsigned_int,_unsigned_long> *x,uint64_t y)

{
  uint64_t y_local;
  BigInt<unsigned_int,_unsigned_long> *x_local;
  BigInt<unsigned_int,_unsigned_long> *z;
  
  BigInt<unsigned_int,_unsigned_long>::BigInt(__return_storage_ptr__,x);
  BigInt<unsigned_int,_unsigned_long>::operator<<=(__return_storage_ptr__,y);
  return __return_storage_ptr__;
}

Assistant:

constexpr BigInt<TBase, TBuffer> operator<<(const BigInt<TBase, TBuffer>& x, uint64_t y)
	{
		BigInt<TBase, TBuffer> z(x);
		z <<= y;
		return z;
	}